

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcIvy.c
# Opt level: O0

Ivy_Man_t * Abc_NtkIvyBefore(Abc_Ntk_t *pNtk,int fSeq,int fUseDc)

{
  int iVar1;
  uint uVar2;
  Vec_Int_t *p;
  Vec_Int_t *vInit;
  int nLatches;
  Ivy_Man_t *pMan;
  int fUseDc_local;
  int fSeq_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkIsNetlist(pNtk);
  if (iVar1 == 0) {
    iVar1 = Abc_NtkIsBddLogic(pNtk);
    if ((iVar1 == 0) || (iVar1 = Abc_NtkBddToSop(pNtk,-1,1000000000), iVar1 != 0)) {
      if ((fSeq != 0) && (iVar1 = Abc_NtkCountSelfFeedLatches(pNtk), iVar1 != 0)) {
        uVar2 = Abc_NtkCountSelfFeedLatches(pNtk);
        printf("Warning: The network has %d self-feeding latches.\n",(ulong)uVar2);
      }
      iVar1 = Abc_NtkGetChoiceNum(pNtk);
      if (iVar1 != 0) {
        printf("Warning: The choice nodes in the initial AIG are removed by strashing.\n");
      }
      pNtk_local = (Abc_Ntk_t *)Abc_NtkToIvy(pNtk);
      iVar1 = Ivy_ManCheck((Ivy_Man_t *)pNtk_local);
      if (iVar1 == 0) {
        printf("AIG check has failed.\n");
        Ivy_ManStop((Ivy_Man_t *)pNtk_local);
        pNtk_local = (Abc_Ntk_t *)0x0;
      }
      else if (fSeq != 0) {
        iVar1 = Abc_NtkLatchNum(pNtk);
        p = Abc_NtkCollectLatchValuesIvy(pNtk,fUseDc);
        Ivy_ManMakeSeq((Ivy_Man_t *)pNtk_local,iVar1,p->pArray);
        Vec_IntFree(p);
      }
    }
    else {
      printf("Abc_NtkIvyBefore(): Converting to SOPs has failed.\n");
      pNtk_local = (Abc_Ntk_t *)0x0;
    }
    return (Ivy_Man_t *)pNtk_local;
  }
  __assert_fail("!Abc_NtkIsNetlist(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcIvy.c"
                ,0x5b,"Ivy_Man_t *Abc_NtkIvyBefore(Abc_Ntk_t *, int, int)");
}

Assistant:

Ivy_Man_t * Abc_NtkIvyBefore( Abc_Ntk_t * pNtk, int fSeq, int fUseDc )
{
    Ivy_Man_t * pMan;
//timeRetime = Abc_Clock();
    assert( !Abc_NtkIsNetlist(pNtk) );
    if ( Abc_NtkIsBddLogic(pNtk) )
    {
        if ( !Abc_NtkBddToSop(pNtk, -1, ABC_INFINITY) )
        {
            printf( "Abc_NtkIvyBefore(): Converting to SOPs has failed.\n" );
            return NULL;
        }
    }
    if ( fSeq && Abc_NtkCountSelfFeedLatches(pNtk) )
    {
        printf( "Warning: The network has %d self-feeding latches.\n", Abc_NtkCountSelfFeedLatches(pNtk) );
//        return NULL;
    }
    // print warning about choice nodes
    if ( Abc_NtkGetChoiceNum( pNtk ) )
        printf( "Warning: The choice nodes in the initial AIG are removed by strashing.\n" );
    // convert to the AIG manager
    pMan = Abc_NtkToIvy( pNtk );
    if ( !Ivy_ManCheck( pMan ) )
    {
        printf( "AIG check has failed.\n" );
        Ivy_ManStop( pMan );
        return NULL;
    }
//    Ivy_ManPrintStats( pMan );
    if ( fSeq )
    {
        int nLatches = Abc_NtkLatchNum(pNtk);
        Vec_Int_t * vInit = Abc_NtkCollectLatchValuesIvy( pNtk, fUseDc );
        Ivy_ManMakeSeq( pMan, nLatches, vInit->pArray );
        Vec_IntFree( vInit );
//        Ivy_ManPrintStats( pMan );
    }
//timeRetime = Abc_Clock() - timeRetime;
    return pMan;
}